

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugi.cpp
# Opt level: O2

xml_node NULLCPugiXML::xml_document__root(xml_document *document)

{
  xml_document *this;
  xml_node local_18;
  
  if (document->impl == (xml_document_impl *)0x0) {
    nullcThrowError("xml_document constructor wasn\'t called");
    local_18._root = (xml_node_struct *)0x0;
    pugi::xml_node::xml_node(&local_18);
  }
  else {
    this = document->impl->document;
    if (this == (xml_document *)0x0) {
      this = (xml_document *)nullcAllocate(0xd0);
      document->impl->document = this;
      pugi::xml_document::xml_document(this);
    }
    pugi::xml_node::xml_node(&local_18);
    local_18 = pugi::xml_node::root(&this->super_xml_node);
  }
  return (xml_node)local_18._root;
}

Assistant:

xml_node	xml_document__root(xml_document* document)
	{
		if(!document->impl){ nullcThrowError("xml_document constructor wasn't called"); return xml_node(); }
		pugi::xml_document *doc = document->impl->document;
		if(!doc)
		{
			doc = document->impl->document = (pugi::xml_document*)nullcAllocate(sizeof(pugi::xml_document));
			::new(doc) pugi::xml_document();
		}
		xml_node ret;
		ret.node = doc->root();
		return ret;
	}